

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cpp
# Opt level: O2

string * __thiscall cppnet::Address::ToIpv6(string *__return_storage_ptr__,Address *this,string *ip)

{
  bool bVar1;
  allocator local_11;
  
  bVar1 = IsIpv4(ip);
  if (bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"::FFFF:",&local_11);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)ip);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Address::ToIpv6(const std::string& ip) {
    if (!IsIpv4(ip)) {
        return ip;
    }
    
    std::string ret("::FFFF:");
    ret.append(ip);
    return ret;
}